

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

bool __thiscall
icu_63::RBBITableBuilder::findDuplicateSafeState(RBBITableBuilder *this,IntPair *states)

{
  int *piVar1;
  short sVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  void *pvVar10;
  IntPair *pIVar11;
  void *pvVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ushort uVar18;
  long lVar19;
  bool bVar20;
  
  iVar5 = this->fSafeTable->count;
  iVar13 = iVar5 + -1;
  iVar14 = states->first;
  bVar9 = iVar14 < iVar13;
  if (iVar14 < iVar13) {
    piVar1 = &states->second;
    do {
      pvVar10 = UVector::elementAt(this->fSafeTable,iVar14);
      pIVar11 = states;
      while( true ) {
        iVar14 = pIVar11->first + 1;
        states->second = iVar14;
        if (iVar5 <= iVar14) break;
        pvVar12 = UVector::elementAt(this->fSafeTable,iVar14);
        sVar2 = *(short *)((long)pvVar10 + 8);
        if (sVar2 < 0) {
          uVar16 = *(uint *)((long)pvVar10 + 0xc);
        }
        else {
          uVar16 = (int)sVar2 >> 5;
        }
        if ((int)uVar16 < 1) {
          return bVar9;
        }
        sVar3 = *(short *)((long)pvVar12 + 8);
        uVar6 = (int)sVar3 >> 5;
        if (sVar3 < 0) {
          uVar6 = *(uint *)((long)pvVar12 + 0xc);
        }
        lVar15 = (long)pvVar10 + 10;
        if (((int)sVar2 & 2U) == 0) {
          lVar15 = *(long *)((long)pvVar10 + 0x18);
        }
        uVar17 = 0;
        bVar7 = true;
        do {
          uVar18 = 0xffff;
          if (uVar17 < uVar6) {
            lVar19 = (long)pvVar12 + 10;
            if (((int)sVar3 & 2U) == 0) {
              lVar19 = *(long *)((long)pvVar12 + 0x18);
            }
            uVar18 = *(ushort *)(lVar19 + uVar17 * 2);
          }
          uVar4 = *(ushort *)(lVar15 + uVar17 * 2);
          if (uVar4 == uVar18) {
LAB_0029d085:
            bVar8 = true;
            bVar20 = bVar7;
          }
          else {
            if (states->first == (uint)uVar4) {
LAB_0029d06d:
              if (states->first != (uint)uVar18) {
                bVar8 = false;
                bVar20 = false;
                if (*piVar1 != (uint)uVar18) goto LAB_0029d08b;
              }
              goto LAB_0029d085;
            }
            bVar8 = false;
            bVar20 = false;
            if (*piVar1 == (uint)uVar4) goto LAB_0029d06d;
          }
LAB_0029d08b:
        } while ((bVar8) && (uVar17 = uVar17 + 1, bVar7 = bVar20, uVar17 < uVar16));
        pIVar11 = (IntPair *)piVar1;
        if (bVar20) {
          return bVar9;
        }
      }
      iVar14 = states->first + 1;
      states->first = iVar14;
      bVar9 = iVar14 < iVar13;
    } while (iVar14 < iVar13);
  }
  return bVar9;
}

Assistant:

bool RBBITableBuilder::findDuplicateSafeState(IntPair *states) {
    int32_t numStates = fSafeTable->size();

    for (; states->first<numStates-1; states->first++) {
        UnicodeString *firstRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->first));
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            UnicodeString *duplRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->second));
            bool rowsMatch = true;
            int32_t numCols = firstRow->length();
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstRow->charAt(col);
                int32_t duplVal = duplRow->charAt(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}